

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

void __thiscall Centaurus::SimpleException::SimpleException(SimpleException *this,string *msg)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__SimpleException_0019ee60;
  (this->m_msg)._M_dataplus._M_p = (pointer)&(this->m_msg).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_msg,pcVar1,pcVar1 + msg->_M_string_length);
  return;
}

Assistant:

SimpleException(const std::string& msg) noexcept
        : m_msg(msg)
    {
    }